

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Samba.cpp
# Opt level: O0

void __thiscall Samba::readXmodem(Samba *this,uint8_t *buffer,int size)

{
  bool bVar1;
  int iVar2;
  pointer pSVar3;
  SambaError *pSVar4;
  int local_ec;
  int local_b0;
  int bytes;
  int retries;
  uint32_t blkNum;
  uint8_t blk [133];
  uint8_t *puStack_18;
  int size_local;
  uint8_t *buffer_local;
  Samba *this_local;
  
  bytes = 1;
  puStack_18 = buffer;
  for (unique0x100002b1 = size; 0 < stack0xffffffffffffffe4;
      register0x00000000 = stack0xffffffffffffffe4 + -0x80) {
    for (local_b0 = 0; local_b0 < 5; local_b0 = local_b0 + 1) {
      if (bytes == 1) {
        pSVar3 = std::unique_ptr<SerialPort,_std::default_delete<SerialPort>_>::operator->
                           (&this->_port);
        (*pSVar3->_vptr_SerialPort[8])(pSVar3,0x43);
      }
      pSVar3 = std::unique_ptr<SerialPort,_std::default_delete<SerialPort>_>::operator->
                         (&this->_port);
      iVar2 = (*pSVar3->_vptr_SerialPort[5])(pSVar3,&retries,0x85);
      if ((((iVar2 == 0x85) && ((char)retries == '\x01')) &&
          ((uint)retries._1_1_ == (bytes & 0xffU))) &&
         (bVar1 = crc16Check(this,(uint8_t *)&retries), bVar1)) break;
      if (bytes != 1) {
        pSVar3 = std::unique_ptr<SerialPort,_std::default_delete<SerialPort>_>::operator->
                           (&this->_port);
        (*pSVar3->_vptr_SerialPort[8])(pSVar3,0x15);
      }
    }
    if (local_b0 == 5) {
      pSVar4 = (SambaError *)__cxa_allocate_exception(8);
      SambaError::SambaError(pSVar4);
      __cxa_throw(pSVar4,&SambaError::typeinfo,SambaError::~SambaError);
    }
    pSVar3 = std::unique_ptr<SerialPort,_std::default_delete<SerialPort>_>::operator->(&this->_port)
    ;
    (*pSVar3->_vptr_SerialPort[8])(pSVar3,6);
    if (stack0xffffffffffffffe4 < 0x80) {
      local_ec = stack0xffffffffffffffe4;
    }
    else {
      local_ec = 0x80;
    }
    memmove(puStack_18,(void *)((long)&retries + 3),(long)local_ec);
    puStack_18 = puStack_18 + 0x80;
    bytes = bytes + 1;
  }
  local_b0 = 0;
  do {
    if (4 < local_b0) {
LAB_00115011:
      if (local_b0 != 5) {
        return;
      }
      pSVar4 = (SambaError *)__cxa_allocate_exception(8);
      SambaError::SambaError(pSVar4);
      __cxa_throw(pSVar4,&SambaError::typeinfo,SambaError::~SambaError);
    }
    pSVar3 = std::unique_ptr<SerialPort,_std::default_delete<SerialPort>_>::operator->(&this->_port)
    ;
    iVar2 = (*pSVar3->_vptr_SerialPort[7])();
    if (iVar2 == 4) {
      pSVar3 = std::unique_ptr<SerialPort,_std::default_delete<SerialPort>_>::operator->
                         (&this->_port);
      (*pSVar3->_vptr_SerialPort[8])(pSVar3,6);
      goto LAB_00115011;
    }
    pSVar3 = std::unique_ptr<SerialPort,_std::default_delete<SerialPort>_>::operator->(&this->_port)
    ;
    (*pSVar3->_vptr_SerialPort[8])(pSVar3,0x15);
    local_b0 = local_b0 + 1;
  } while( true );
}

Assistant:

void
Samba::readXmodem(uint8_t* buffer, int size)
{
    uint8_t blk[BLK_SIZE + 5];
    uint32_t blkNum = 1;
    int retries;
    int bytes;

    while (size > 0)
    {
        for (retries = 0; retries < MAX_RETRIES; retries++)
        {
            if (blkNum == 1)
                _port->put(START);

            bytes = _port->read(blk, sizeof(blk));
            if (bytes == sizeof(blk) &&
                blk[0] == SOH &&
                blk[1] == (blkNum & 0xff) &&
                crc16Check(blk))
                break;

            if (blkNum != 1)
                _port->put(NAK);
        }
        if (retries == MAX_RETRIES)
            throw SambaError();

        _port->put(ACK);

        memmove(buffer, &blk[3], min(size, BLK_SIZE));
        buffer += BLK_SIZE;
        size -= BLK_SIZE;
        blkNum++;
    }

    for (retries = 0; retries < MAX_RETRIES; retries++)
    {
        if (_port->get() == EOT)
        {
            _port->put(ACK);
            break;
        }
        _port->put(NAK);
    }
    if (retries == MAX_RETRIES)
        throw SambaError();
}